

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlChar * xmlTextReaderLookupNamespace(xmlTextReaderPtr reader,xmlChar *prefix)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlNsPtr ns;
  xmlNsPtr local_10;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    return (xmlChar *)0x0;
  }
  if (reader->node != (xmlNodePtr)0x0) {
    iVar1 = xmlSearchNsSafe(reader->node,prefix,&local_10);
    if (iVar1 < 0) {
      xmlTextReaderErrMemory(reader);
    }
    else if (local_10 != (xmlNsPtr)0x0) {
      pxVar2 = readerStrdup(reader,local_10->href);
      return pxVar2;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlTextReaderLookupNamespace(xmlTextReaderPtr reader, const xmlChar *prefix) {
    xmlNsPtr ns;
    int result;

    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);

    result = xmlSearchNsSafe(reader->node, prefix, &ns);
    if (result < 0) {
        xmlTextReaderErrMemory(reader);
        return(NULL);
    }
    if (ns == NULL)
	return(NULL);
    return(readerStrdup(reader, ns->href));
}